

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::pumpTo
          (BlockedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  AdapterBase *pAVar1;
  _func_int *p_Var2;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  Maybe<kj::Canceler::AdapterBase_&> MVar3;
  undefined8 uVar4;
  void *pvVar5;
  _func_int **pp_Var6;
  AsyncPipe *in_RCX;
  AsyncPipe *pAVar7;
  ArrayPtr<const_unsigned_char> *adapterConstructorParams;
  AsyncPipe *pAVar8;
  Maybe<kj::Canceler::AdapterBase_&> *pMVar9;
  AsyncPipe *pAVar10;
  undefined1 *puVar11;
  TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:605:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
  *location_02;
  TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:631:43),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
  *location_03;
  TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:658:43),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
  *location_04;
  bool bVar12;
  Promise<void> promise;
  OwnPromiseNode intermediate;
  DebugExpression<bool> _kjCondition;
  void *continuationTracePtr;
  uint64_t n;
  OwnPromiseNode intermediate_1;
  Fault f;
  Maybe<kj::Canceler::AdapterBase_&> local_108;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_100;
  Maybe<kj::Canceler::AdapterBase_&> local_f8;
  anon_class_24_2_d8a1eacd_for_func local_f0;
  AsyncPipe *local_d8;
  anon_class_16_2_d8ee3cd1_for_errorHandler local_d0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  ArrayPtr<const_unsigned_char> *local_90;
  BlockedWrite *local_80;
  undefined1 local_78 [24];
  Canceler local_60;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  ArrayPtr<const_unsigned_char> *local_48;
  AsyncPipe *local_40;
  _func_int **local_38;
  
  bVar12 = output[0xc]._vptr_AsyncOutputStream == (_func_int **)0x0;
  local_f0.output = (AsyncOutputStream *)CONCAT71(local_f0.output._1_7_,bVar12);
  if (!bVar12) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              ((Fault *)local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,600,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)&local_f0,(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal((Fault *)local_b0);
  }
  adapterConstructorParams = (ArrayPtr<const_unsigned_char> *)(output + 0xc);
  local_b0._0_8_ = output;
  if (in_RCX < (AsyncPipe *)output[5]._vptr_AsyncOutputStream) {
    (*(code *)**(undefined8 **)amount)(&local_f8,amount,output[4]._vptr_AsyncOutputStream);
    MVar3.ptr = local_f8.ptr;
    local_f0.output = (AsyncOutputStream *)output[2]._vptr_AsyncOutputStream;
    local_d0.fulfiller =
         (PromiseFulfiller<void> *)
         kj::_::
         TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:605:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
         ::anon_class_16_2_34952053_for_func::operator();
    pAVar1 = (AdapterBase *)((local_f8.ptr)->prev).ptr;
    local_f0.more.ptr = adapterConstructorParams;
    local_b0._8_8_ = in_RCX;
    if (pAVar1 == (AdapterBase *)0x0 || (ulong)((long)local_f8.ptr - (long)pAVar1) < 0x40) {
      pvVar5 = operator_new(0x400);
      location_02 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:605:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
                     *)((long)pvVar5 + 0x3c0);
      ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_f8,
                 (anon_class_16_2_34952053_for_func *)local_b0,(anon_class_16_2_d8ee3cd1 *)&local_f0
                 ,&local_d0.fulfiller);
      *(void **)((long)pvVar5 + 0x3c8) = pvVar5;
    }
    else {
      ((local_f8.ptr)->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
      location_02 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:605:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
                     *)&local_f8.ptr[-3].prev;
      ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_f8,
                 (anon_class_16_2_34952053_for_func *)local_b0,(anon_class_16_2_d8ee3cd1 *)&local_f0
                 ,&local_d0.fulfiller);
      MVar3.ptr[-3].next.ptr = pAVar1;
    }
    local_100.ptr = (PromiseNode *)0x0;
    local_c0._8_8_ =
         (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:631:43),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
          *)0x0;
    local_50.ptr = (PromiseNode *)location_02;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_c0 + 8));
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_100);
    newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
              ((kj *)this,(Canceler *)adapterConstructorParams,(Promise<unsigned_long> *)&local_50);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_50);
    pMVar9 = &local_f8;
  }
  else {
    pAVar8 = (AsyncPipe *)0x0;
    pAVar7 = (AsyncPipe *)output[5]._vptr_AsyncOutputStream;
    for (pp_Var6 = output[6]._vptr_AsyncOutputStream + 1;
        (pAVar10 = (AsyncPipe *)output[7]._vptr_AsyncOutputStream,
        (AsyncPipe *)output[7]._vptr_AsyncOutputStream != pAVar8 &&
        (p_Var2 = *pp_Var6, pAVar10 = pAVar8, (AsyncPipe *)(p_Var2 + (long)pAVar7) <= in_RCX));
        pp_Var6 = pp_Var6 + 2) {
      pAVar8 = (AsyncPipe *)
               ((long)&(((TransformPromiseNodeBase *)&pAVar8->super_AsyncCapabilityStream)->
                       super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember + 1);
      pAVar7 = (AsyncPipe *)(p_Var2 + (long)pAVar7);
    }
    local_d8 = (AsyncPipe *)amount;
    (*(code *)**(undefined8 **)amount)(&local_108,amount,output[4]._vptr_AsyncOutputStream);
    MVar3.ptr = local_108.ptr;
    local_78._8_8_ = adapterConstructorParams;
    if (pAVar10 != (AsyncPipe *)0x0) {
      local_f0.more.ptr = (ArrayPtr<const_unsigned_char> *)output[6]._vptr_AsyncOutputStream;
      local_f0.output = (AsyncOutputStream *)local_d8;
      local_d0.fulfiller =
           (PromiseFulfiller<void> *)
           kj::_::
           SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:626:32)>
           ::anon_class_24_2_d8a1eacd_for_func::operator();
      pMVar9 = ((local_108.ptr)->prev).ptr;
      local_f0.more.size_ = (size_t)pAVar10;
      local_80 = this;
      if (pMVar9 == (Maybe<kj::Canceler::AdapterBase_&> *)0x0 ||
          (ulong)((long)local_108.ptr - (long)pMVar9) < 0x38) {
        pvVar5 = operator_new(0x400);
        ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_2_,void*&>
                  ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:626:32)>
                    *)((long)pvVar5 + 0x3c8),
                   (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,&local_f0,
                   &local_d0.fulfiller);
        *(void **)((long)pvVar5 + 0x3d0) = pvVar5;
        local_100.ptr = (PromiseNode *)((long)pvVar5 + 0x3c8);
      }
      else {
        ((local_108.ptr)->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
        local_78._0_8_ = &local_108.ptr[-3].next;
        ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_2_,void*&>
                  ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:626:32)>
                    *)local_78._0_8_,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                   &local_f0,&local_d0.fulfiller);
        MVar3.ptr[-2]._vptr_AdapterBase = (_func_int **)pMVar9;
        local_100.ptr = (PromiseNode *)local_78._0_8_;
      }
      adapterConstructorParams = (ArrayPtr<const_unsigned_char> *)local_78._8_8_;
      local_b0._0_8_ = &DAT_0042a172;
      local_b0._8_8_ = &DAT_0042a1d1;
      local_b0._16_8_ = (uchar *)0x4c0000058b;
      location.function = &DAT_0042a1d1;
      location.fileName = &DAT_0042a172;
      location.lineNumber = 0x58b;
      location.columnNumber = 0x4c;
      kj::_::maybeChain<void>((OwnPromiseNode *)&local_f8,(Promise<void> *)&local_100,location);
      MVar3.ptr = local_f8.ptr;
      local_f8.ptr = (AdapterBase *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_f8);
      local_c0._0_8_ = MVar3.ptr;
      local_c0._8_8_ = (_func_int **)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_c0 + 8));
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_100);
      this = local_80;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_c0);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_c0);
    }
    MVar3.ptr = local_108.ptr;
    local_78._0_8_ = output[7]._vptr_AsyncOutputStream;
    if (pAVar10 == (AsyncPipe *)local_78._0_8_) {
      local_b0._8_8_ = local_d8;
      local_d0.fulfiller = (PromiseFulfiller<void> *)output[2]._vptr_AsyncOutputStream;
      local_f0.output = (AsyncOutputStream *)0x4e0aab;
      local_f0.more.ptr = (ArrayPtr<const_unsigned_char> *)0x4d729f;
      local_f0.more.size_ = 0x1e00000277;
      local_100.ptr =
           (PromiseNode *)
           kj::_::
           TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:631:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
           ::anon_class_32_4_246a692a_for_func::operator();
      pMVar9 = ((local_108.ptr)->prev).ptr;
      local_d0.canceler = (Canceler *)adapterConstructorParams;
      local_b0._16_8_ = in_RCX;
      local_b0._24_8_ = pAVar7;
      if (pMVar9 == (Maybe<kj::Canceler::AdapterBase_&> *)0x0 ||
          (ulong)((long)local_108.ptr - (long)pMVar9) < 0x50) {
        local_b0._0_8_ = output;
        pvVar5 = operator_new(0x400);
        location_03 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:631:43),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                       *)((long)pvVar5 + 0x3b0);
        ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                  (location_03,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                   (anon_class_32_4_246a692a_for_func *)local_b0,&local_d0,&local_100.ptr);
        *(void **)((long)pvVar5 + 0x3b8) = pvVar5;
      }
      else {
        ((local_108.ptr)->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
        location_03 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:631:43),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                       *)&local_108.ptr[-4].next;
        local_b0._0_8_ = output;
        ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_3_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionPromise<unsigned_long,kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                  (location_03,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                   (anon_class_32_4_246a692a_for_func *)local_b0,&local_d0,&local_100.ptr);
        local_108.ptr[-3]._vptr_AdapterBase = (_func_int **)pMVar9;
      }
      location_00.function = (char *)local_f0.more.ptr;
      location_00.fileName = (char *)local_f0.output;
      location_00.lineNumber = (undefined4)local_f0.more.size_;
      location_00.columnNumber = local_f0.more.size_._4_4_;
      local_c0._8_8_ = location_03;
      kj::_::maybeChain<unsigned_long>
                ((OwnPromiseNode *)local_c0,(Promise<unsigned_long> *)(local_c0 + 8),location_00);
      uVar4 = local_c0._0_8_;
      local_c0._0_8_ =
           (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:626:32)>
            *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_c0);
      local_58.ptr = (PromiseNode *)uVar4;
      local_f8.ptr = (AdapterBase *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_f8);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_c0 + 8));
      newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
                ((kj *)this,(Canceler *)adapterConstructorParams,(Promise<unsigned_long> *)&local_58
                );
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
    }
    else {
      pAVar8 = (AsyncPipe *)((long)in_RCX - (long)pAVar7);
      local_b0._0_8_ = local_c0;
      local_38 = output[6]._vptr_AsyncOutputStream;
      local_48 = (ArrayPtr<const_unsigned_char> *)local_38[(long)pAVar10 * 2];
      local_b0._8_8_ = local_38[(long)pAVar10 * 2 + 1];
      local_b0._16_8_ = " <= ";
      local_b0._24_8_ = &DAT_00000005;
      local_40 = (AsyncPipe *)(local_b0._8_8_ - (long)pAVar8);
      local_90 = (ArrayPtr<const_unsigned_char> *)
                 CONCAT71(local_90._1_7_,(ulong)local_b0._8_8_ >= pAVar8);
      local_c0._0_8_ = pAVar8;
      if ((ulong)local_b0._8_8_ < pAVar8) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                  ((Fault *)&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x288,FAILED,"n <= splitPiece.size()","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long> *)local_b0);
        kj::_::Debug::Fault::fatal((Fault *)&local_f0);
      }
      if (in_RCX != pAVar7) {
        local_f0.output = (AsyncOutputStream *)local_d8;
        local_d0.fulfiller =
             (PromiseFulfiller<void> *)
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:653:34)>
             ::anon_class_24_2_e72e484a_for_func::operator();
        pMVar9 = ((local_108.ptr)->prev).ptr;
        local_f0.more.ptr = local_48;
        local_f0.more.size_ = (size_t)pAVar8;
        local_80 = this;
        if (pMVar9 == (Maybe<kj::Canceler::AdapterBase_&> *)0x0 ||
            (ulong)((long)local_108.ptr - (long)pMVar9) < 0x38) {
          pvVar5 = operator_new(0x400);
          local_d8 = (AsyncPipe *)((long)pvVar5 + 0x3c8);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_4_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_4_,void*&>
                    ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:653:34)>
                      *)local_d8,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                     (anon_class_24_2_e72e484a_for_func *)&local_f0,&local_d0.fulfiller);
          *(void **)((long)pvVar5 + 0x3d0) = pvVar5;
        }
        else {
          ((local_108.ptr)->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
          local_d8 = (AsyncPipe *)&local_108.ptr[-3].next;
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_4_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_4_,void*&>
                    ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:653:34)>
                      *)local_d8,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                     (anon_class_24_2_e72e484a_for_func *)&local_f0,&local_d0.fulfiller);
          MVar3.ptr[-2]._vptr_AdapterBase = (_func_int **)pMVar9;
        }
        this = local_80;
        local_100.ptr = (PromiseNode *)local_d8;
        local_b0._0_8_ = &DAT_0042a172;
        local_b0._8_8_ = &DAT_0042a1d1;
        local_b0._16_8_ = (uchar *)0x4c0000058b;
        location_01.function = &DAT_0042a1d1;
        location_01.fileName = &DAT_0042a172;
        location_01.lineNumber = 0x58b;
        location_01.columnNumber = 0x4c;
        kj::_::maybeChain<void>((OwnPromiseNode *)&local_f8,(Promise<void> *)&local_100,location_01)
        ;
        MVar3.ptr = local_f8.ptr;
        local_f8.ptr = (AdapterBase *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_f8);
        local_60.list.ptr =
             (Maybe<kj::Canceler::AdapterBase_&>)(Maybe<kj::Canceler::AdapterBase_&>)MVar3.ptr;
        local_c0._8_8_ = (_func_int **)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_c0 + 8));
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_100);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                   (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_60);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_60);
      }
      uVar4 = local_78._8_8_;
      local_b0._8_8_ = (long)local_48 + (long)pAVar8;
      puVar11 = (undefined1 *)
                ((long)&(((TransformPromiseNodeBase *)&pAVar10->super_AsyncCapabilityStream)->
                        super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember + 1);
      local_90 = (ArrayPtr<const_unsigned_char> *)(local_78._0_8_ - (long)puVar11);
      local_b0._24_8_ = local_38 + (long)puVar11 * 2;
      local_b0._16_8_ = local_40;
      local_f0.output = (AsyncOutputStream *)output[2]._vptr_AsyncOutputStream;
      local_f0.more.ptr = (ArrayPtr<const_unsigned_char> *)local_78._8_8_;
      local_d0.fulfiller =
           (PromiseFulfiller<void> *)
           kj::_::
           TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:658:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
           ::anon_class_48_4_354179c9_for_func::operator();
      pMVar9 = ((local_108.ptr)->prev).ptr;
      if (pMVar9 == (Maybe<kj::Canceler::AdapterBase_&> *)0x0 ||
          (ulong)((long)local_108.ptr - (long)pMVar9) < 0x60) {
        local_b0._0_8_ = output;
        pvVar5 = operator_new(0x400);
        location_04 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:658:43),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
                       *)((long)pvVar5 + 0x3a0);
        ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                  (location_04,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                   (anon_class_48_4_354179c9_for_func *)local_b0,
                   (anon_class_16_2_d8ee3cd1 *)&local_f0,&local_d0.fulfiller);
        *(void **)((long)pvVar5 + 0x3a8) = pvVar5;
      }
      else {
        ((local_108.ptr)->prev).ptr = (Maybe<kj::Canceler::AdapterBase_&> *)0x0;
        location_04 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:658:43),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:447:12)>
                       *)(local_108.ptr + -4);
        local_b0._0_8_ = output;
        ctor<kj::_::TransformPromiseNode<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_5_,kj::(anonymous_namespace)::AsyncPipe::teeExceptionSize<kj::PromiseFulfiller<void>>(kj::PromiseFulfiller<void>&,kj::Canceler&)::_lambda(kj::Exception&&)_1_,void*&>
                  (location_04,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_108,
                   (anon_class_48_4_354179c9_for_func *)local_b0,
                   (anon_class_16_2_d8ee3cd1 *)&local_f0,&local_d0.fulfiller);
        local_108.ptr[-4].prev.ptr = pMVar9;
      }
      local_100.ptr = (PromiseNode *)0x0;
      local_c0._8_8_ =
           (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:631:43),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
            *)0x0;
      local_78._16_8_ = location_04;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_c0 + 8));
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_100);
      newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
                ((kj *)this,(Canceler *)uVar4,(Promise<unsigned_long> *)(local_78 + 0x10));
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_78 + 0x10));
    }
    pMVar9 = &local_108;
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)pMVar9);
  return (Promise<unsigned_long>)(PromiseNode *)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}